

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O0

void ggml_backend_tensor_memset(ggml_tensor *tensor,uint8_t value,size_t offset,size_t size)

{
  int64_t *piVar1;
  size_t sVar2;
  long in_RCX;
  ggml_tensor *in_RDX;
  undefined1 in_SIL;
  long in_RDI;
  ggml_backend_buffer_t buf;
  long local_30;
  
  if (*(long *)(in_RDI + 0xe8) == 0) {
    local_30 = *(long *)(in_RDI + 8);
  }
  else {
    local_30 = *(long *)(*(long *)(in_RDI + 0xe8) + 8);
  }
  if (in_RCX != 0) {
    if (local_30 == 0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-backend.cpp"
                 ,0x125,"GGML_ASSERT(%s) failed","buf != NULL && \"tensor buffer not set\"");
    }
    if (*(long *)(in_RDI + 0xf8) == 0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-backend.cpp"
                 ,0x126,"GGML_ASSERT(%s) failed","tensor->data != NULL && \"tensor not allocated\"")
      ;
    }
    piVar1 = in_RDX->ne;
    sVar2 = ggml_nbytes(in_RDX);
    if (sVar2 < (ulong)((long)piVar1 + in_RCX + -0x10)) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-backend.cpp"
                 ,0x127,"GGML_ASSERT(%s) failed",
                 "offset + size <= ggml_nbytes(tensor) && \"tensor write out of bounds\"");
    }
    if (*(long *)(local_30 + 0x18) == 0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-backend.cpp"
                 ,0x128,"GGML_ASSERT(%s) failed",
                 "buf->iface.memset_tensor != NULL && \"memset not implemented by backend buffer\"")
      ;
    }
    (**(code **)(local_30 + 0x18))(local_30,in_RDI,in_SIL,in_RDX,in_RCX);
  }
  return;
}

Assistant:

void ggml_backend_tensor_memset(struct ggml_tensor * tensor, uint8_t value, size_t offset, size_t size) {
    ggml_backend_buffer_t buf = tensor->view_src ? tensor->view_src->buffer : tensor->buffer;

    if (size == 0) {
        return;
    }

    GGML_ASSERT(buf != NULL && "tensor buffer not set");
    GGML_ASSERT(tensor->data != NULL && "tensor not allocated");
    GGML_ASSERT(offset + size <= ggml_nbytes(tensor) && "tensor write out of bounds");
    GGML_ASSERT(buf->iface.memset_tensor != NULL && "memset not implemented by backend buffer");

    buf->iface.memset_tensor(buf, tensor, value, offset, size);
}